

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

int __thiscall
CVmObjStringBuffer::getp_append
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_val_t *pvVar1;
  int iVar2;
  ushort *puVar3;
  vm_val_t strval;
  
  if (getp_append(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_append(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar2 != 0) {
      getp_append::desc.min_argc_ = 1;
      getp_append::desc.opt_argc_ = 0;
      getp_append::desc.varargs_ = 0;
      __cxa_guard_release(&getp_append(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_append::desc);
  if (iVar2 == 0) {
    puVar3 = (ushort *)vm_val_t::cast_to_string(sp_ + -1,&strval);
    pvVar1 = sp_;
    pvVar1[-1].typ = strval.typ;
    *(undefined4 *)&pvVar1[-1].field_0x4 = strval._4_4_;
    pvVar1[-1].val = strval.val;
    insert_text(this,self,*(int32_t *)(this->super_CVmObject).ext_,(char *)(puVar3 + 1),
                (uint)*puVar3,1);
    sp_ = sp_ + -1;
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_append(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get or cast the string; leave it on the stack for gc protection */
    vm_val_t strval;
    const char *str = G_stk->get(0)->cast_to_string(vmg_ &strval);
    *G_stk->get(0) = strval;

    /* insert the string at the end of the buffer */
    insert_text(vmg_ self, get_ext()->len,
                str + VMB_LEN, vmb_get_len(str), TRUE);

    /* discard gc protection */
    G_stk->discard();

    /* handled */
    retval->set_obj(self);
    return TRUE;
}